

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::addRow(Highs *this,double lower_bound,double upper_bound,HighsInt num_new_nz,
             HighsInt *indices,double *values)

{
  HighsStatus HVar1;
  double upper_bound_local;
  double lower_bound_local;
  HighsInt starts;
  
  upper_bound_local = upper_bound;
  lower_bound_local = lower_bound;
  if ((this->written_log_header_ == false) &&
     (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true)) {
    highsLogHeader(&(this->options_).super_HighsOptionsStruct.log_options,
                   (this->options_).super_HighsOptionsStruct.log_githash);
    this->written_log_header_ = true;
  }
  starts = 0;
  HVar1 = addRows(this,1,&lower_bound_local,&upper_bound_local,num_new_nz,&starts,indices,values);
  return HVar1;
}

Assistant:

HighsStatus Highs::addRow(const double lower_bound, const double upper_bound,
                          const HighsInt num_new_nz, const HighsInt* indices,
                          const double* values) {
  this->logHeader();
  HighsInt starts = 0;
  return addRows(1, &lower_bound, &upper_bound, num_new_nz, &starts, indices,
                 values);
}